

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

int TabItemComparerBySection(void *lhs,void *rhs)

{
  undefined4 local_40;
  undefined4 local_3c;
  int b_section;
  int a_section;
  ImGuiTabItem *b;
  ImGuiTabItem *a;
  void *rhs_local;
  void *lhs_local;
  
  if ((*(uint *)((long)lhs + 4) & 0x40) == 0) {
    local_3c = 1;
    if ((*(uint *)((long)lhs + 4) & 0x80) != 0) {
      local_3c = 2;
    }
  }
  else {
    local_3c = 0;
  }
  if ((*(uint *)((long)rhs + 4) & 0x40) == 0) {
    local_40 = 1;
    if ((*(uint *)((long)rhs + 4) & 0x80) != 0) {
      local_40 = 2;
    }
  }
  else {
    local_40 = 0;
  }
  if (local_3c == local_40) {
    lhs_local._4_4_ = (int)*(short *)((long)lhs + 0x28) - (int)*(short *)((long)rhs + 0x28);
  }
  else {
    lhs_local._4_4_ = local_3c - local_40;
  }
  return lhs_local._4_4_;
}

Assistant:

static int IMGUI_CDECL TabItemComparerBySection(const void* lhs, const void* rhs)
{
    const ImGuiTabItem* a = (const ImGuiTabItem*)lhs;
    const ImGuiTabItem* b = (const ImGuiTabItem*)rhs;
    const int a_section = (a->Flags & ImGuiTabItemFlags_Leading) ? 0 : (a->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
    const int b_section = (b->Flags & ImGuiTabItemFlags_Leading) ? 0 : (b->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
    if (a_section != b_section)
        return a_section - b_section;
    return (int)(a->IndexDuringLayout - b->IndexDuringLayout);
}